

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O2

void isobusfs_send_nack(int sock,isobusfs_msg *msg)

{
  int iVar1;
  undefined8 uVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  isobusfs_nack nack;
  sockaddr_can addr;
  
  uVar2 = *(undefined8 *)((long)&(msg->peername).can_addr + 8);
  addr.can_family = (msg->peername).can_family;
  addr._2_2_ = *(undefined2 *)&(msg->peername).field_0x2;
  addr.can_ifindex = (msg->peername).can_ifindex;
  addr.can_addr.tp = (msg->peername).can_addr.tp;
  nack.ctrl = '\x01';
  nack.group_function = msg->buf[0];
  nack.reserved[0] = 0xff;
  nack.reserved[1] = 0xff;
  addr.can_addr.j1939.addr = (__u8)((ulong)uVar2 >> 0x20);
  nack.address_nack = addr.can_addr.j1939.addr;
  nack.pgn_nack._0_2_ = *(undefined2 *)((long)&(msg->peername).can_addr + 8);
  nack.pgn_nack[2] = *(uint8_t *)((long)&(msg->peername).can_addr + 10);
  addr.can_addr._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  addr.can_addr.j1939.pgn = 0xe800;
  sVar3 = sendto(sock,&nack,8,0x40,(sockaddr *)&addr,0x18);
  if ((int)sVar3 < 0) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    pcVar5 = strerror(-iVar1);
    isobusfs_log(LOG_LEVEL_WARN,"failed to send NACK: %i (%s)",(ulong)(uint)-iVar1,pcVar5);
  }
  isobusfs_log(LOG_LEVEL_DEBUG,"send NACK");
  return;
}

Assistant:

void isobusfs_send_nack(int sock, struct isobusfs_msg *msg)
{
	struct sockaddr_can addr = msg->peername;
	struct isobusfs_nack nack;
	int ret;

	nack.ctrl = ISOBUS_ACK_CTRL_NACK;
	nack.group_function = msg->buf[0];
	memset(&nack.reserved[0], 0xff, sizeof(nack.reserved));
	nack.address_nack = addr.can_addr.j1939.addr;
	memcpy(&nack.pgn_nack[0], &addr.can_addr.j1939.pgn,
		sizeof(nack.pgn_nack));

	addr.can_addr.j1939.pgn = ISOBUS_PGN_ACK;
	ret = sendto(sock, &nack, sizeof(nack), MSG_DONTWAIT,
			  (struct sockaddr *)&addr,
			   sizeof(addr));
	if (ret < 0) {
		ret = -errno;
		pr_warn("failed to send NACK: %i (%s)", ret, strerror(ret));
	}

	pr_debug("send NACK");
}